

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool google::protobuf::internal::MergeFromImpl<true>
               (ZeroCopyInputStream *input,MessageLite *msg,TcParseTableBase *tc_table,
               ParseFlags parse_flags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ushort *puVar4;
  ParseContext ctx;
  ushort *local_a0;
  ParseContext local_98;
  
  local_98.super_EpsCopyInputStream.zcis_ = (ZeroCopyInputStream *)0x0;
  local_98.super_EpsCopyInputStream.patch_buffer_[0] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[1] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[2] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[3] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[4] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[5] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[6] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[7] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[8] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[9] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[10] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0xb] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0xc] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0xd] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0xe] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0xf] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x10] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x11] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x12] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x13] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x14] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x15] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x16] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x17] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x18] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x19] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x1a] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x1b] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x1c] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x1d] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x1e] = '\0';
  local_98.super_EpsCopyInputStream.patch_buffer_[0x1f] = '\0';
  local_98.super_EpsCopyInputStream.aliasing_ = 1;
  local_98.super_EpsCopyInputStream.last_tag_minus_1_ = 0;
  local_98.super_EpsCopyInputStream.overall_limit_ = 0x7fffffff;
  local_98.depth_ = io::CodedInputStream::default_recursion_limit_;
  local_98.group_depth_ = -0x80000000;
  local_98.data_.pool = (DescriptorPool *)0x0;
  local_98.data_.factory = (MessageFactory *)0x0;
  local_a0 = (ushort *)EpsCopyInputStream::InitFrom(&local_98.super_EpsCopyInputStream,input);
  while (bVar1 = EpsCopyInputStream::DoneWithCheck
                           (&local_98.super_EpsCopyInputStream,(char **)&local_a0,
                            local_98.group_depth_), !bVar1) {
    uVar2 = (uint)tc_table->fast_idx_mask & (uint)*local_a0;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    local_a0 = (ushort *)
               (**(code **)(&tc_table[1].has_bits_offset + uVar3))
                         (msg,local_a0,&local_98,
                          (ulong)*local_a0 ^ *(ulong *)(&tc_table[1].fast_idx_mask + uVar3 * 2),
                          tc_table,0);
    if ((local_a0 == (ushort *)0x0) || (local_98.super_EpsCopyInputStream.last_tag_minus_1_ != 0))
    break;
  }
  puVar4 = local_a0;
  if ((tc_table->field_0x9 & 1) != 0) {
    puVar4 = (ushort *)(*tc_table->post_loop_handler)(msg,(char *)local_a0,&local_98);
  }
  bVar1 = false;
  if ((puVar4 != (ushort *)0x0) &&
     (bVar1 = false, local_98.super_EpsCopyInputStream.last_tag_minus_1_ == 1)) {
    if ((parse_flags & kMergePartial) == kMerge) {
      bVar1 = MessageLite::IsInitializedWithErrors(msg);
    }
    else {
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  // ctx has no explicit limit (hence we end on end of stream)
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}